

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

bool vkt::image::anon_unknown_0::comparePixelBuffers
               (TestContext *testCtx,ImageType imageType,UVec3 *imageSize,TextureFormat *format,
               ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result)

{
  undefined4 uVar1;
  bool bVar2;
  VkFormat VVar3;
  deUint32 dVar4;
  TestLog *pTVar5;
  char *pcVar6;
  char *pcVar7;
  bool local_2c5;
  Vector<float,_4> local_2c4;
  Vector<unsigned_int,_4> local_2b4;
  bool local_2a1;
  undefined1 local_2a0 [7];
  bool ok;
  ConstPixelBufferAccess resultLayer;
  ConstPixelBufferAccess refLayer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  uint local_1ec;
  string local_1e8;
  uint local_1c4;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string comparisonDesc;
  string local_88;
  undefined1 local_68 [8];
  string comparisonName;
  deUint32 local_40;
  deUint32 layerNdx;
  deUint32 passedLayers;
  bool intFormat;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  TextureFormat *format_local;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  TestContext *testCtx_local;
  
  VVar3 = ::vk::mapTextureFormat(format);
  bVar2 = ::vk::isIntFormat(VVar3);
  local_2c5 = true;
  if (!bVar2) {
    VVar3 = ::vk::mapTextureFormat(format);
    local_2c5 = ::vk::isUintFormat(VVar3);
  }
  local_40 = 0;
  comparisonName.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = comparisonName.field_2._12_4_;
    dVar4 = getNumLayers(imageType,imageSize);
    if (dVar4 <= (uint)uVar1) break;
    de::toString<unsigned_int>(&local_88,(uint *)(comparisonName.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "Comparison",&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,"Image Comparison, ",&local_b9);
    std::allocator<char>::~allocator(&local_b9);
    if (imageType == IMAGE_TYPE_3D) {
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "slice ");
      de::toString<unsigned_int>(&local_120,(uint *)(comparisonName.field_2._M_local_buf + 0xc));
      std::operator+(&local_e0,&local_100,&local_120);
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else if (imageType - IMAGE_TYPE_CUBE < 2) {
      std::operator+(&local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "face ");
      local_1c4 = (uint)comparisonName.field_2._12_4_ % 6;
      de::toString<unsigned_int>(&local_1c0,&local_1c4);
      std::operator+(&local_180,&local_1a0,&local_1c0);
      std::operator+(&local_160,&local_180,", cube ");
      local_1ec = (uint)comparisonName.field_2._12_4_ / 6;
      de::toString<unsigned_int>(&local_1e8,&local_1ec);
      std::operator+(&local_140,&local_160,&local_1e8);
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    else {
      std::operator+(&local_230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "layer ");
      de::toString<unsigned_int>
                ((string *)&refLayer.m_data,(uint *)(comparisonName.field_2._M_local_buf + 0xc));
      std::operator+(&local_210,&local_230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &refLayer.m_data);
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&refLayer.m_data);
      std::__cxx11::string::~string((string *)&local_230);
    }
    getLayerOrSlice((ConstPixelBufferAccess *)&resultLayer.m_data,imageType,reference,
                    comparisonName.field_2._12_4_);
    getLayerOrSlice((ConstPixelBufferAccess *)local_2a0,imageType,result,
                    comparisonName.field_2._12_4_);
    local_2a1 = false;
    if (local_2c5 == false) {
      pTVar5 = tcu::TestContext::getLog(testCtx);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      tcu::Vector<float,_4>::Vector(&local_2c4,0.01);
      local_2a1 = tcu::floatThresholdCompare
                            (pTVar5,pcVar6,pcVar7,(ConstPixelBufferAccess *)&resultLayer.m_data,
                             (ConstPixelBufferAccess *)local_2a0,&local_2c4,COMPARE_LOG_RESULT);
    }
    else {
      pTVar5 = tcu::TestContext::getLog(testCtx);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector(&local_2b4,0);
      local_2a1 = tcu::intThresholdCompare
                            (pTVar5,pcVar6,pcVar7,(ConstPixelBufferAccess *)&resultLayer.m_data,
                             (ConstPixelBufferAccess *)local_2a0,&local_2b4,COMPARE_LOG_RESULT);
    }
    if (local_2a1 != false) {
      local_40 = local_40 + 1;
    }
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_68);
    comparisonName.field_2._12_4_ = comparisonName.field_2._12_4_ + 1;
  }
  dVar4 = getNumLayers(imageType,imageSize);
  return local_40 == dVar4;
}

Assistant:

bool comparePixelBuffers (tcu::TestContext&						testCtx,
						  const ImageType						imageType,
						  const tcu::UVec3&						imageSize,
						  const tcu::TextureFormat&				format,
						  const tcu::ConstPixelBufferAccess&	reference,
						  const tcu::ConstPixelBufferAccess&	result)
{
	DE_ASSERT(reference.getFormat() == result.getFormat());
	DE_ASSERT(reference.getSize() == result.getSize());

	const bool		 intFormat			= isIntFormat(mapTextureFormat(format)) || isUintFormat(mapTextureFormat(format));
	deUint32		 passedLayers		= 0;

	for (deUint32 layerNdx = 0; layerNdx < getNumLayers(imageType, imageSize); ++layerNdx)
	{
		const std::string comparisonName = "Comparison" + de::toString(layerNdx);

		std::string comparisonDesc = "Image Comparison, ";
		switch (imageType)
		{
			case IMAGE_TYPE_3D:
				comparisonDesc = comparisonDesc + "slice " + de::toString(layerNdx);
				break;

			case IMAGE_TYPE_CUBE:
			case IMAGE_TYPE_CUBE_ARRAY:
				comparisonDesc = comparisonDesc + "face " + de::toString(layerNdx % 6) + ", cube " + de::toString(layerNdx / 6);
				break;

			default:
				comparisonDesc = comparisonDesc + "layer " + de::toString(layerNdx);
				break;
		}

		const tcu::ConstPixelBufferAccess refLayer		= getLayerOrSlice(imageType, reference, layerNdx);
		const tcu::ConstPixelBufferAccess resultLayer	= getLayerOrSlice(imageType, result, layerNdx);

		bool ok = false;
		if (intFormat)
			ok = tcu::intThresholdCompare(testCtx.getLog(), comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::UVec4(0), tcu::COMPARE_LOG_RESULT);
		else
			ok = tcu::floatThresholdCompare(testCtx.getLog(), comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);

		if (ok)
			++passedLayers;
	}

	return passedLayers == getNumLayers(imageType, imageSize);
}